

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O0

void __thiscall Arbiter_Time_Test::TestBody(Arbiter_Time_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_3a0;
  Message local_398;
  int local_38c;
  long local_388;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_5;
  string local_368 [39];
  allocator local_341;
  string local_340 [32];
  Time local_320 [8];
  Time t;
  Message local_310;
  int local_304;
  long local_300;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_4;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [32];
  Time local_298 [8];
  Time epoch;
  Message local_288;
  long local_280;
  long local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_3;
  Message local_258;
  long local_250;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_2;
  int64_t delta;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  Time local_1e0 [8];
  Time y;
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [32];
  Time local_188 [8];
  Time x;
  Message local_178;
  int local_16c;
  long local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_1;
  Message local_148;
  allocator local_139;
  string local_138 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  allocator local_f1;
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  string local_40 [32];
  Time local_20 [8];
  Time b;
  Time a;
  Arbiter_Time_Test *this_local;
  
  arbiter::Time::Time(&b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"%Y-%m-%dT%H:%M:%SZ",&local_61);
  arbiter::Time::str(local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,"%Y-%m-%dT%H:%M:%SZ",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  arbiter::Time::Time(local_20,local_40,local_98);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"%Y-%m-%dT%H:%M:%SZ",&local_f1);
  arbiter::Time::str((string *)&local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"%Y-%m-%dT%H:%M:%SZ",&local_139);
  arbiter::Time::str((string *)&local_118);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_b0,"a.str()","b.str()",&local_d0,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/test/unit.cpp"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_168 = arbiter::Time::operator-(&b,local_20);
  local_16c = 0;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((EqHelper<false> *)local_160,"a - b","0",&local_168,&local_16c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&x,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/test/unit.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&x,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&x);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"2016-03-18T03:14:42Z",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"%Y-%m-%dT%H:%M:%SZ",&local_1d1);
  arbiter::Time::Time(local_188,local_1a8,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"2016-03-18T04:24:54Z",&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"%Y-%m-%dT%H:%M:%SZ",(allocator *)((long)&delta + 7));
  arbiter::Time::Time(local_1e0,local_200,local_228);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)((long)&delta + 7));
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  gtest_ar_2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1074;
  local_250 = arbiter::Time::operator-(local_1e0,local_188);
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_248,"y - x","delta",&local_250,(long *)&gtest_ar_2.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/test/unit.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  local_278 = arbiter::Time::operator-(local_188,local_1e0);
  local_280 = -0x1074;
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_270,"x - y","-delta",&local_278,&local_280);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&epoch,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/test/unit.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&epoch,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&epoch);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"1970-01-01T00:00:00Z",&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2e0,"%Y-%m-%dT%H:%M:%SZ",(allocator *)((long)&gtest_ar_4.message_.ptr_ + 7));
  arbiter::Time::Time(local_298,local_2b8,local_2e0);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_4.message_.ptr_ + 7));
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  local_300 = arbiter::Time::asUnix();
  local_304 = 0;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((EqHelper<false> *)local_2f8,"epoch.asUnix()","0",&local_300,&local_304);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&t,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/test/unit.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&t,&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&t);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"2019-01-03T17:39:11Z",&local_341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_368,"%Y-%m-%dT%H:%M:%SZ",(allocator *)((long)&gtest_ar_5.message_.ptr_ + 7));
  arbiter::Time::Time(local_320,local_340,local_368);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_5.message_.ptr_ + 7));
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  local_388 = arbiter::Time::asUnix();
  local_388 = local_388 + -0x5c2e48bf;
  local_38c = 0;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((EqHelper<false> *)local_380,"t.asUnix() - 1546537151","0",&local_388,&local_38c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/test/unit.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  return;
}

Assistant:

TEST(Arbiter, Time)
{
    Time a;
    Time b(a.str());

    EXPECT_EQ(a.str(), b.str());
    EXPECT_EQ(a - b, 0);

    Time x("2016-03-18T03:14:42Z");
    Time y("2016-03-18T04:24:54Z");
    const int64_t delta(1 * 60 * 60 + 10 * 60 + 12);

    EXPECT_EQ(y - x, delta);
    EXPECT_EQ(x - y, -delta);

    Time epoch("1970-01-01T00:00:00Z");
    EXPECT_EQ(epoch.asUnix(), 0);

    // Issue 23.
    {
        Time t("2019-01-03T17:39:11Z");
        EXPECT_EQ(t.asUnix() - 1546537151, 0);
    }
}